

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O3

uint32_t AccumulateSSE_SSE2(uint8_t *src1,uint8_t *src2,int len)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  uint uVar31;
  ulong uVar32;
  uint32_t uVar33;
  undefined1 auVar34 [16];
  int iVar35;
  int iVar38;
  int iVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  uVar33 = 0;
  uVar31 = 0;
  if (0xf < len) {
    auVar34 = *(undefined1 (*) [16])src2;
    auVar42 = *(undefined1 (*) [16])src1;
    uVar32 = 0x10;
    if ((uint)len < 0x30) {
      iVar35 = 0;
      iVar38 = 0;
      iVar39 = 0;
      iVar40 = 0;
    }
    else {
      uVar32 = 0x10;
      iVar35 = 0;
      iVar38 = 0;
      iVar39 = 0;
      iVar40 = 0;
      do {
        auVar41 = psubusb(auVar42,auVar34);
        auVar34 = psubusb(auVar34,auVar42);
        auVar34 = auVar34 | auVar41;
        auVar1[0xd] = 0;
        auVar1._0_13_ = auVar34._0_13_;
        auVar1[0xe] = auVar34[7];
        auVar4[0xc] = auVar34[6];
        auVar4._0_12_ = auVar34._0_12_;
        auVar4._13_2_ = auVar1._13_2_;
        auVar7[0xb] = 0;
        auVar7._0_11_ = auVar34._0_11_;
        auVar7._12_3_ = auVar4._12_3_;
        auVar10[10] = auVar34[5];
        auVar10._0_10_ = auVar34._0_10_;
        auVar10._11_4_ = auVar7._11_4_;
        auVar13[9] = 0;
        auVar13._0_9_ = auVar34._0_9_;
        auVar13._10_5_ = auVar10._10_5_;
        auVar16[8] = auVar34[4];
        auVar16._0_8_ = auVar34._0_8_;
        auVar16._9_6_ = auVar13._9_6_;
        auVar22._7_8_ = 0;
        auVar22._0_7_ = auVar16._8_7_;
        auVar25._1_8_ = SUB158(auVar22 << 0x40,7);
        auVar25[0] = auVar34[3];
        auVar25._9_6_ = 0;
        auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
        auVar26[0] = auVar34[2];
        auVar26._11_4_ = 0;
        auVar19[2] = auVar34[1];
        auVar19._0_2_ = auVar34._0_2_;
        auVar19._3_12_ = SUB1512(auVar26 << 0x20,3);
        auVar41._0_2_ = auVar34._0_2_ & 0xff;
        auVar41._2_13_ = auVar19._2_13_;
        auVar41[0xf] = 0;
        auVar42[1] = 0;
        auVar42[0] = auVar34[8];
        auVar42[2] = auVar34[9];
        auVar42[3] = 0;
        auVar42[4] = auVar34[10];
        auVar42[5] = 0;
        auVar42[6] = auVar34[0xb];
        auVar42[7] = 0;
        auVar42[8] = auVar34[0xc];
        auVar42[9] = 0;
        auVar42[10] = auVar34[0xd];
        auVar42[0xb] = 0;
        auVar42[0xc] = auVar34[0xe];
        auVar42[0xd] = 0;
        auVar42[0xe] = auVar34[0xf];
        auVar42[0xf] = 0;
        auVar43 = pmaddwd(auVar41,auVar41);
        auVar41 = pmaddwd(auVar42,auVar42);
        auVar34 = psubusb(*(undefined1 (*) [16])(src1 + uVar32),
                          *(undefined1 (*) [16])(src2 + uVar32));
        auVar36 = psubusb(*(undefined1 (*) [16])(src2 + uVar32),
                          *(undefined1 (*) [16])(src1 + uVar32));
        auVar36 = auVar36 | auVar34;
        auVar2[0xd] = 0;
        auVar2._0_13_ = auVar36._0_13_;
        auVar2[0xe] = auVar36[7];
        auVar5[0xc] = auVar36[6];
        auVar5._0_12_ = auVar36._0_12_;
        auVar5._13_2_ = auVar2._13_2_;
        auVar8[0xb] = 0;
        auVar8._0_11_ = auVar36._0_11_;
        auVar8._12_3_ = auVar5._12_3_;
        auVar11[10] = auVar36[5];
        auVar11._0_10_ = auVar36._0_10_;
        auVar11._11_4_ = auVar8._11_4_;
        auVar14[9] = 0;
        auVar14._0_9_ = auVar36._0_9_;
        auVar14._10_5_ = auVar11._10_5_;
        auVar17[8] = auVar36[4];
        auVar17._0_8_ = auVar36._0_8_;
        auVar17._9_6_ = auVar14._9_6_;
        auVar23._7_8_ = 0;
        auVar23._0_7_ = auVar17._8_7_;
        auVar27._1_8_ = SUB158(auVar23 << 0x40,7);
        auVar27[0] = auVar36[3];
        auVar27._9_6_ = 0;
        auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
        auVar28[0] = auVar36[2];
        auVar28._11_4_ = 0;
        auVar20[2] = auVar36[1];
        auVar20._0_2_ = auVar36._0_2_;
        auVar20._3_12_ = SUB1512(auVar28 << 0x20,3);
        auVar34._0_2_ = auVar36._0_2_ & 0xff;
        auVar34._2_13_ = auVar20._2_13_;
        auVar34[0xf] = 0;
        auVar44 = pmaddwd(auVar34,auVar34);
        auVar34 = *(undefined1 (*) [16])(src2 + uVar32 + 0x10);
        auVar42 = *(undefined1 (*) [16])(src1 + uVar32 + 0x10);
        uVar32 = uVar32 + 0x20;
        auVar37[1] = 0;
        auVar37[0] = auVar36[8];
        auVar37[2] = auVar36[9];
        auVar37[3] = 0;
        auVar37[4] = auVar36[10];
        auVar37[5] = 0;
        auVar37[6] = auVar36[0xb];
        auVar37[7] = 0;
        auVar37[8] = auVar36[0xc];
        auVar37[9] = 0;
        auVar37[10] = auVar36[0xd];
        auVar37[0xb] = 0;
        auVar37[0xc] = auVar36[0xe];
        auVar37[0xd] = 0;
        auVar37[0xe] = auVar36[0xf];
        auVar37[0xf] = 0;
        auVar36 = pmaddwd(auVar37,auVar37);
        iVar35 = auVar36._0_4_ + auVar44._0_4_ + auVar41._0_4_ + auVar43._0_4_ + iVar35;
        iVar38 = auVar36._4_4_ + auVar44._4_4_ + auVar41._4_4_ + auVar43._4_4_ + iVar38;
        iVar39 = auVar36._8_4_ + auVar44._8_4_ + auVar41._8_4_ + auVar43._8_4_ + iVar39;
        iVar40 = auVar36._12_4_ + auVar44._12_4_ + auVar41._12_4_ + auVar43._12_4_ + iVar40;
      } while (uVar32 <= len - 0x20);
    }
    uVar31 = (uint)uVar32;
    auVar41 = psubusb(auVar42,auVar34);
    auVar34 = psubusb(auVar34,auVar42);
    auVar34 = auVar34 | auVar41;
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar34._0_13_;
    auVar3[0xe] = auVar34[7];
    auVar6[0xc] = auVar34[6];
    auVar6._0_12_ = auVar34._0_12_;
    auVar6._13_2_ = auVar3._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar34._0_11_;
    auVar9._12_3_ = auVar6._12_3_;
    auVar12[10] = auVar34[5];
    auVar12._0_10_ = auVar34._0_10_;
    auVar12._11_4_ = auVar9._11_4_;
    auVar15[9] = 0;
    auVar15._0_9_ = auVar34._0_9_;
    auVar15._10_5_ = auVar12._10_5_;
    auVar18[8] = auVar34[4];
    auVar18._0_8_ = auVar34._0_8_;
    auVar18._9_6_ = auVar15._9_6_;
    auVar24._7_8_ = 0;
    auVar24._0_7_ = auVar18._8_7_;
    auVar29._1_8_ = SUB158(auVar24 << 0x40,7);
    auVar29[0] = auVar34[3];
    auVar29._9_6_ = 0;
    auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
    auVar30[0] = auVar34[2];
    auVar30._11_4_ = 0;
    auVar21[2] = auVar34[1];
    auVar21._0_2_ = auVar34._0_2_;
    auVar21._3_12_ = SUB1512(auVar30 << 0x20,3);
    auVar43._0_2_ = auVar34._0_2_ & 0xff;
    auVar43._2_13_ = auVar21._2_13_;
    auVar43[0xf] = 0;
    auVar36[1] = 0;
    auVar36[0] = auVar34[8];
    auVar36[2] = auVar34[9];
    auVar36[3] = 0;
    auVar36[4] = auVar34[10];
    auVar36[5] = 0;
    auVar36[6] = auVar34[0xb];
    auVar36[7] = 0;
    auVar36[8] = auVar34[0xc];
    auVar36[9] = 0;
    auVar36[10] = auVar34[0xd];
    auVar36[0xb] = 0;
    auVar36[0xc] = auVar34[0xe];
    auVar36[0xd] = 0;
    auVar36[0xe] = auVar34[0xf];
    auVar36[0xf] = 0;
    auVar42 = pmaddwd(auVar43,auVar43);
    auVar34 = pmaddwd(auVar36,auVar36);
    uVar33 = auVar34._12_4_ + auVar42._12_4_ + iVar40 + auVar34._4_4_ + auVar42._4_4_ + iVar38 +
             auVar34._8_4_ + auVar42._8_4_ + iVar39 + auVar34._0_4_ + auVar42._0_4_ + iVar35;
  }
  if ((int)uVar31 < len) {
    uVar32 = (ulong)uVar31;
    do {
      uVar33 = uVar33 + ((uint)src1[uVar32] - (uint)src2[uVar32]) *
                        ((uint)src1[uVar32] - (uint)src2[uVar32]);
      uVar32 = uVar32 + 1;
    } while ((uint)len != uVar32);
  }
  return uVar33;
}

Assistant:

static uint32_t AccumulateSSE_SSE2(const uint8_t* src1,
                                   const uint8_t* src2, int len) {
  int i = 0;
  uint32_t sse2 = 0;
  if (len >= 16) {
    const int limit = len - 32;
    int32_t tmp[4];
    __m128i sum1;
    __m128i sum = _mm_setzero_si128();
    __m128i a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
    __m128i b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
    i += 16;
    while (i <= limit) {
      const __m128i a1 = _mm_loadu_si128((const __m128i*)&src1[i]);
      const __m128i b1 = _mm_loadu_si128((const __m128i*)&src2[i]);
      __m128i sum2;
      i += 16;
      SubtractAndSquare_SSE2(a0, b0, &sum1);
      sum = _mm_add_epi32(sum, sum1);
      a0 = _mm_loadu_si128((const __m128i*)&src1[i]);
      b0 = _mm_loadu_si128((const __m128i*)&src2[i]);
      i += 16;
      SubtractAndSquare_SSE2(a1, b1, &sum2);
      sum = _mm_add_epi32(sum, sum2);
    }
    SubtractAndSquare_SSE2(a0, b0, &sum1);
    sum = _mm_add_epi32(sum, sum1);
    _mm_storeu_si128((__m128i*)tmp, sum);
    sse2 += (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
  }

  for (; i < len; ++i) {
    const int32_t diff = src1[i] - src2[i];
    sse2 += diff * diff;
  }
  return sse2;
}